

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                *tokens)

{
  pointer __n;
  int iVar1;
  long lVar2;
  pointer pbVar3;
  string *arg;
  ulong uVar4;
  size_type *local_50;
  string doubleDash;
  
  local_50 = &doubleDash._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--","");
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
    uVar4 = 1;
    lVar2 = 0x20;
    do {
      __n = *(pointer *)((long)&pbVar3->_M_string_length + lVar2);
      arg = (string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar2);
      if (__n == doubleDash._M_dataplus._M_p) {
        if (__n == (pointer)0x0) break;
        iVar1 = bcmp((arg->_M_dataplus)._M_p,local_50,(size_t)__n);
        if (iVar1 == 0) break;
      }
      parseIntoTokens(this,arg,tokens);
      uVar4 = uVar4 + 1;
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x20;
    } while (uVar4 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5))
    ;
  }
  if (local_50 != &doubleDash._M_string_length) {
    operator_delete(local_50,doubleDash._M_string_length + 1);
  }
  return;
}

Assistant:

void parseIntoTokens( std::vector<std::string> const& args, std::vector<Token>& tokens ) {
            const std::string doubleDash = "--";
            for( std::size_t i = 1; i < args.size() && args[i] != doubleDash; ++i )
                parseIntoTokens( args[i], tokens);
        }